

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::reset(Iterator<Indexing::RetrievalAlgorithms::RobUnification<Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
        *this)

{
  int *piVar1;
  BacktrackData ***pppBVar2;
  BacktrackData *pBVar3;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pIVar4;
  BacktrackObject *pBVar5;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar6;
  BacktrackData *pBVar7;
  BacktrackData *pBVar8;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar9;
  BacktrackObject *pBVar10;
  
  pVVar6 = (this->_nodeIterators)._stack;
  (this->_svStack)._cursor = (this->_svStack)._stack;
  for (pVVar9 = (this->_nodeIterators)._cursor; pVVar9 != pVVar6; pVVar9 = pVVar9 + -1) {
    pIVar4 = pVVar9[-1]._core;
    if (pIVar4 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                   *)0x0) {
      piVar1 = &pIVar4->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar4->_vptr_IteratorCore[1])();
        pVVar6 = (this->_nodeIterators)._stack;
      }
    }
  }
  (this->_nodeIterators)._cursor = pVVar6;
  (this->_bdStack)._cursor = (this->_bdStack)._stack;
  if (this->_normalizationRecording == true) {
    pppBVar2 = &(this->_algo)._subs.super_Backtrackable._bdStack._cursor;
    *pppBVar2 = *pppBVar2 + -1;
    this->_normalizationRecording = false;
    pBVar10 = (this->_normalizationBacktrackData)._boList;
    if (pBVar10 != (BacktrackObject *)0x0) {
      do {
        (*pBVar10->_vptr_BacktrackObject[2])(pBVar10);
        pBVar5 = pBVar10->_next;
        (*pBVar10->_vptr_BacktrackObject[1])(pBVar10);
        pBVar10 = pBVar5;
      } while (pBVar5 != (BacktrackObject *)0x0);
      pBVar7 = (this->_bdStack)._stack;
      pBVar8 = (this->_bdStack)._cursor;
      (this->_normalizationBacktrackData)._boList = (BacktrackObject *)0x0;
      if (pBVar8 != pBVar7) {
        do {
          (this->_bdStack)._cursor = pBVar8 + -1;
          pBVar3 = pBVar8 + -1;
          pBVar8 = pBVar8 + -1;
          pBVar10 = pBVar3->_boList;
          if (pBVar3->_boList != (BacktrackObject *)0x0) {
            do {
              (*pBVar10->_vptr_BacktrackObject[2])(pBVar10);
              pBVar5 = pBVar10->_next;
              (*pBVar10->_vptr_BacktrackObject[1])(pBVar10);
              pBVar10 = pBVar5;
            } while (pBVar5 != (BacktrackObject *)0x0);
            pBVar7 = (this->_bdStack)._stack;
            pBVar8 = (this->_bdStack)._cursor;
          }
        } while (pBVar8 != pBVar7);
      }
    }
  }
  pBVar10 = (this->_queryInitBacktrackData)._boList;
  while (pBVar10 != (BacktrackObject *)0x0) {
    (*pBVar10->_vptr_BacktrackObject[2])(pBVar10);
    pBVar5 = pBVar10->_next;
    (*pBVar10->_vptr_BacktrackObject[1])(pBVar10);
    pBVar10 = pBVar5;
  }
  (this->_queryInitBacktrackData)._boList = (BacktrackObject *)0x0;
  return;
}

Assistant:

void reset() {
        _iterCntr.reset();
        _svStack.reset();
        _nodeIterators.reset();
        _bdStack.reset();
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }
        while(_bdStack.isNonEmpty()) {
          _bdStack.pop().backtrack();
        }
        _queryInitBacktrackData.backtrack();
      }